

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeComment(XmlWriter *this,StringRef text,XmlFormatting fmt)

{
  ostream *poVar1;
  
  ensureTagClosed(this);
  if ((fmt & Indent) != None) {
    std::operator<<(this->m_os,(string *)&this->m_indent);
  }
  poVar1 = std::operator<<(this->m_os,"<!-- ");
  poVar1 = (ostream *)std::ostream::write((char *)poVar1,(long)text.m_start);
  std::operator<<(poVar1," -->");
  this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeComment( StringRef text, XmlFormatting fmt ) {
        ensureTagClosed();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
        }
        m_os << "<!-- " << text << " -->";
        applyFormatting(fmt);
        return *this;
    }